

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::TemplateNode> __thiscall
minja::Parser::parseTemplate
          (Parser *this,TemplateTokenIterator *begin,TemplateTokenIterator *it,
          TemplateTokenIterator *end,bool fully)

{
  char cVar1;
  Type TVar2;
  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *puVar3;
  TemplateToken *pTVar4;
  element_type *peVar5;
  shared_ptr<minja::TemplateNode> *psVar6;
  int iVar7;
  long lVar8;
  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *puVar9;
  Parser *pPVar10;
  runtime_error *this_00;
  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *puVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CharIterator CVar14;
  undefined7 in_register_00000081;
  long *plVar15;
  undefined4 in_R9D;
  TemplateTokenIterator *pTVar16;
  bool bVar17;
  bool bVar18;
  shared_ptr<minja::TemplateNode> sVar19;
  shared_ptr<minja::TemplateNode> body;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  TemplateTokenIterator *local_a0;
  shared_ptr<minja::TemplateNode> else_body;
  vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  children;
  Location local_58;
  CharIterator local_40;
  undefined4 local_34;
  
  plVar15 = (long *)CONCAT71(in_register_00000081,fully);
  children.
  super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  children.
  super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  children.
  super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = it;
  local_40._M_current = (char *)this;
  local_34 = in_R9D;
LAB_0017c8d7:
  do {
    puVar3 = end->_M_current;
    if (puVar3 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                  *plVar15) break;
    puVar9 = puVar3 + 1;
    end->_M_current = puVar9;
    pTVar4 = (puVar3->_M_t).
             super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
             ._M_t.
             super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
             .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl;
    if (pTVar4 == (TemplateToken *)0x0) {
LAB_0017d468:
      pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
      unexpected(pPVar10,(TemplateToken *)begin);
      __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,&IfTemplateToken::typeinfo,0);
    pTVar16 = local_a0;
    if (lVar8 == 0) {
      lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,&ForTemplateToken::typeinfo,0);
      pTVar16 = local_a0;
      if (lVar8 != 0) {
        parseTemplate((Parser *)&body,begin,local_a0,end,fully);
        else_body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        else_body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        puVar9 = end->_M_current;
        puVar11 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                  *plVar15;
        if (puVar9 == puVar11) {
LAB_0017d4a1:
          pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
          unterminated(pPVar10,(TemplateToken *)begin);
          __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (((puVar9->_M_t).
             super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
             ._M_t.
             super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
             .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type == Else) {
          end->_M_current = puVar9 + 1;
          parseTemplate((Parser *)&local_58,begin,pTVar16,end,fully);
          std::__shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&else_body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_58.source.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          puVar9 = end->_M_current;
          puVar11 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                    *plVar15;
        }
        if ((puVar9 == puVar11) ||
           (end->_M_current = puVar9 + 1,
           ((puVar9->_M_t).
            super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>.
            _M_t.
            super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
            .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type != EndFor))
        goto LAB_0017d4a1;
        std::
        make_shared<minja::ForNode,minja::Location&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>,bool&,std::shared_ptr<minja::TemplateNode>>
                  (&local_58,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&((puVar3->_M_t).
                        super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                        .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->
                       location,(shared_ptr<minja::Expression> *)(lVar8 + 0x30),
                   (shared_ptr<minja::Expression> *)(lVar8 + 0x48),
                   (shared_ptr<minja::TemplateNode> *)(lVar8 + 0x58),(bool *)&body,
                   (shared_ptr<minja::TemplateNode> *)(lVar8 + 0x68));
        std::
        vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
        ::emplace_back<std::shared_ptr<minja::ForNode>>
                  ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                    *)&children,(shared_ptr<minja::ForNode> *)&local_58);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_58.source.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        goto LAB_0017ccc9;
      }
      lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,&GenerationTemplateToken::typeinfo,0);
      if (lVar8 == 0) {
        lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,&TextTemplateToken::typeinfo,0);
        pTVar16 = local_a0;
        if (lVar8 != 0) {
          if (local_a0->_M_current == puVar3) {
            bVar17 = false;
          }
          else {
            bVar17 = (puVar3[-1]._M_t.
                      super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                      .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->
                     post_space == Strip;
          }
          if (puVar9 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         *)*plVar15) {
            bVar18 = false;
          }
          else {
            bVar18 = ((puVar9->_M_t).
                      super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                      .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->pre_space
                     == Strip;
          }
          std::__cxx11::string::string((string *)&body,(string *)(lVar8 + 0x30));
          if (bVar18) {
            if ((parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                 ::trailing_space_regex_abi_cxx11_ == '\0') &&
               (iVar7 = __cxa_guard_acquire(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                             ::trailing_space_regex_abi_cxx11_), iVar7 != 0)) {
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                        (&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                          ::trailing_space_regex_abi_cxx11_,"\\s+$",0x10);
              __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                           ~basic_regex,
                           &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                            ::trailing_space_regex_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                   ::trailing_space_regex_abi_cxx11_);
              pTVar16 = local_a0;
            }
            std::
            regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &else_body,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&body,
                       &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                        ::trailing_space_regex_abi_cxx11_,"",0);
            std::__cxx11::string::operator=((string *)&body,(string *)&else_body);
            std::__cxx11::string::~string((string *)&else_body);
          }
          else if ((*(char *)((long)&begin[5]._M_current + 1) == '\x01') &&
                  (_Var12 = body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,
                  end->_M_current !=
                  (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                  *plVar15)) {
            do {
              p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&_Var12._M_pi[-1]._M_weak_count + 3);
              if (_Var12._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (end->_M_current + -1 != pTVar16->_M_current) goto LAB_0017ce96;
                goto LAB_0017ce8e;
              }
              cVar1 = ((undefined1 *)
                      ((long)&body.
                              super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr[-1].location_.pos + 7))[(long)_Var12._M_pi];
              _Var12._M_pi = p_Var13;
            } while ((cVar1 == '\t') || (cVar1 == ' '));
            if (cVar1 == '\n') {
LAB_0017ce8e:
              std::__cxx11::string::resize((ulong)&body);
            }
          }
LAB_0017ce96:
          if (bVar17) {
            if ((parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                 ::leading_space_regex_abi_cxx11_ == '\0') &&
               (iVar7 = __cxa_guard_acquire(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                             ::leading_space_regex_abi_cxx11_), iVar7 != 0)) {
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                        (&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                          ::leading_space_regex_abi_cxx11_,"^\\s+",0x10);
              __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                           ~basic_regex,
                           &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                            ::leading_space_regex_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                   ::leading_space_regex_abi_cxx11_);
            }
            std::
            regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &else_body,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&body,
                       &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                        ::leading_space_regex_abi_cxx11_,"",0);
            std::__cxx11::string::operator=((string *)&body,(string *)&else_body);
            std::__cxx11::string::~string((string *)&else_body);
          }
          else if ((((*(char *)&begin[5]._M_current == '\x01') &&
                    (end->_M_current + -1 != pTVar16->_M_current)) &&
                   ((pTVar4 = end->_M_current[-2]._M_t.
                              super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                              .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl,
                    pTVar4 == (TemplateToken *)0x0 ||
                    (lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,
                                            &ExpressionTemplateToken::typeinfo,0), lVar8 == 0)))) &&
                  ((body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
                   (*(char *)&(body.
                               super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->_vptr_TemplateNode == '\n')))) {
            std::__cxx11::string::erase((ulong)&body,0);
          }
          if ((((end->_M_current ==
                 (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                 *plVar15) && (*(char *)((long)&begin[5]._M_current + 2) == '\0')) &&
              (body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) &&
             (((undefined1 *)
              ((long)&body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr[-1].location_.pos + 7))
              [(long)body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi] == '\n')) {
            std::__cxx11::string::resize((ulong)&body);
          }
          std::make_shared<minja::TextNode,minja::Location&,std::__cxx11::string&>
                    ((Location *)&else_body,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &((puVar3->_M_t).
                       super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                       .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->location
                    );
          std::
          vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
          ::emplace_back<std::shared_ptr<minja::TextNode>>
                    ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                      *)&children,(shared_ptr<minja::TextNode> *)&else_body);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&else_body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&body);
          goto LAB_0017c8d7;
        }
        lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,&ExpressionTemplateToken::typeinfo,0)
        ;
        if (lVar8 == 0) {
          lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,&SetTemplateToken::typeinfo,0);
          if (lVar8 == 0) {
            lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,&MacroTemplateToken::typeinfo,0);
            if (lVar8 == 0) {
              lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,&FilterTemplateToken::typeinfo,
                                     0);
              if (lVar8 == 0) {
                lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,
                                       &CommentTemplateToken::typeinfo,0);
                if (lVar8 == 0) {
                  lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,
                                         &LoopControlTemplateToken::typeinfo,0);
                  if (lVar8 != 0) {
                    std::
                    make_shared<minja::LoopControlNode,minja::Location&,minja::LoopControlType&>
                              ((Location *)&body,(LoopControlType *)&pTVar4->location);
                    std::
                    vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                    ::emplace_back<std::shared_ptr<minja::LoopControlNode>>
                              ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                                *)&children,(shared_ptr<minja::LoopControlNode> *)&body);
                    goto LAB_0017cd22;
                  }
                  lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,
                                         &EndForTemplateToken::typeinfo,0);
                  if ((((lVar8 == 0) &&
                       (lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,
                                               &EndSetTemplateToken::typeinfo,0), lVar8 == 0)) &&
                      (lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,
                                              &EndMacroTemplateToken::typeinfo,0), lVar8 == 0)) &&
                     (((lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,
                                               &EndFilterTemplateToken::typeinfo,0), lVar8 == 0 &&
                       (lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,
                                               &EndIfTemplateToken::typeinfo,0), lVar8 == 0)) &&
                      ((lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,
                                               &ElseTemplateToken::typeinfo,0), lVar8 == 0 &&
                       ((lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,
                                                &EndGenerationTemplateToken::typeinfo,0), lVar8 == 0
                        && (lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,
                                                   &ElifTemplateToken::typeinfo,0), lVar8 == 0))))))
                     )) goto LAB_0017d468;
                  end->_M_current = puVar3;
                  break;
                }
                goto LAB_0017c8d7;
              }
              parseTemplate((Parser *)&body,begin,local_a0,end,fully);
              puVar9 = end->_M_current;
              if ((puVar9 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              *)*plVar15) ||
                 (end->_M_current = puVar9 + 1,
                 ((puVar9->_M_t).
                  super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                  .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type !=
                 EndFilter)) {
                pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
                unterminated(pPVar10,(TemplateToken *)begin);
                __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              std::
              make_shared<minja::FilterNode,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>
                        ((Location *)&else_body,
                         (shared_ptr<minja::Expression> *)
                         &((puVar3->_M_t).
                           super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                           .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->
                          location,(shared_ptr<minja::TemplateNode> *)(lVar8 + 0x30));
              std::
              vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
              ::emplace_back<std::shared_ptr<minja::FilterNode>>
                        ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                          *)&children,(shared_ptr<minja::FilterNode> *)&else_body);
            }
            else {
              parseTemplate((Parser *)&body,begin,local_a0,end,fully);
              puVar9 = end->_M_current;
              if ((puVar9 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              *)*plVar15) ||
                 (end->_M_current = puVar9 + 1,
                 ((puVar9->_M_t).
                  super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                  .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type !=
                 EndMacro)) {
                pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
                unterminated(pPVar10,(TemplateToken *)begin);
                __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              std::
              make_shared<minja::MacroNode,minja::Location&,std::shared_ptr<minja::VariableExpr>,std::vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>,std::shared_ptr<minja::TemplateNode>>
                        ((Location *)&else_body,
                         (shared_ptr<minja::VariableExpr> *)
                         &((puVar3->_M_t).
                           super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                           .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->
                          location,
                         (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                          *)(lVar8 + 0x30),(shared_ptr<minja::TemplateNode> *)(lVar8 + 0x40));
              std::
              vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
              ::emplace_back<std::shared_ptr<minja::MacroNode>>
                        ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                          *)&children,(shared_ptr<minja::MacroNode> *)&else_body);
            }
          }
          else {
            if (*(long *)(lVar8 + 0x68) != 0) {
              std::
              make_shared<minja::SetNode,minja::Location&,std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::shared_ptr<minja::Expression>>
                        ((Location *)&body,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pTVar4->location,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(lVar8 + 0x30),(shared_ptr<minja::Expression> *)(lVar8 + 0x50));
              std::
              vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
              ::emplace_back<std::shared_ptr<minja::SetNode>>
                        ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                          *)&children,(shared_ptr<minja::SetNode> *)&body);
              goto LAB_0017cd22;
            }
            parseTemplate((Parser *)&body,begin,local_a0,end,fully);
            puVar9 = end->_M_current;
            if ((puVar9 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)*plVar15) ||
               (end->_M_current = puVar9 + 1,
               ((puVar9->_M_t).
                super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                ._M_t.
                super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type != EndSet)
               ) {
              pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
              unterminated(pPVar10,(TemplateToken *)begin);
              __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            if (*(long *)(lVar8 + 0x38) != 0) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"Namespaced set not supported in set with template value");
LAB_0017d5ec:
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            if (*(long *)(lVar8 + 0x58) - (long)*(shared_ptr<minja::TemplateNode> **)(lVar8 + 0x50)
                != 0x20) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"Structural assignment not supported in set with template value");
              goto LAB_0017d5ec;
            }
            std::
            make_shared<minja::SetTemplateNode,minja::Location&,std::__cxx11::string&,std::shared_ptr<minja::TemplateNode>>
                      ((Location *)&else_body,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &((puVar3->_M_t).
                         super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                         .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->
                        location,*(shared_ptr<minja::TemplateNode> **)(lVar8 + 0x50));
            std::
            vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
            ::emplace_back<std::shared_ptr<minja::SetTemplateNode>>
                      ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                        *)&children,(shared_ptr<minja::SetTemplateNode> *)&else_body);
          }
LAB_0017ccc9:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&else_body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
          std::
          make_shared<minja::ExpressionNode,minja::Location&,std::shared_ptr<minja::Expression>>
                    ((Location *)&body,(shared_ptr<minja::Expression> *)&pTVar4->location);
          std::
          vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
          ::emplace_back<std::shared_ptr<minja::ExpressionNode>>
                    ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                      *)&children,(shared_ptr<minja::ExpressionNode> *)&body);
        }
      }
      else {
        parseTemplate((Parser *)&body,begin,local_a0,end,fully);
        puVar3 = end->_M_current;
        if ((puVar3 == (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)*plVar15) ||
           (end->_M_current = puVar3 + 1,
           ((puVar3->_M_t).
            super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>.
            _M_t.
            super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
            .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type !=
           EndGeneration)) {
          pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
          unterminated(pPVar10,(TemplateToken *)begin);
          __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
        ::emplace_back<std::shared_ptr<minja::TemplateNode>>
                  ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                    *)&children,&body);
      }
LAB_0017cd22:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_0017c8d7;
    }
    body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_b8._M_allocated_capacity = 0;
    parseTemplate((Parser *)&else_body,begin,local_a0,end,fully);
    std::
    vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
    ::emplace_back<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>
              ((vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
                *)&body,(shared_ptr<minja::Expression> *)(lVar8 + 0x30),&else_body);
    while( true ) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&else_body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      puVar9 = end->_M_current;
      puVar11 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                *plVar15;
      if (puVar9 == puVar11) goto LAB_0017d219;
      TVar2 = ((puVar9->_M_t).
               super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
               ._M_t.
               super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
               .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type;
      if (TVar2 != Elif) break;
      end->_M_current = puVar9 + 1;
      pTVar4 = (puVar9->_M_t).
               super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
               ._M_t.
               super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
               .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl;
      if (pTVar4 == (TemplateToken *)0x0) {
        lVar8 = 0;
      }
      else {
        lVar8 = __dynamic_cast(pTVar4,&TemplateToken::typeinfo,&ElifTemplateToken::typeinfo,0);
      }
      parseTemplate((Parser *)&else_body,begin,pTVar16,end,fully);
      std::
      vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
      ::emplace_back<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>
                ((vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
                  *)&body,(shared_ptr<minja::Expression> *)(lVar8 + 0x30),&else_body);
    }
    if (TVar2 == Else) {
      local_58.source.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      end->_M_current = puVar9 + 1;
      parseTemplate((Parser *)&else_body,begin,pTVar16,end,fully);
      std::
      vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
      ::emplace_back<decltype(nullptr),std::shared_ptr<minja::TemplateNode>>
                ((vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
                  *)&body,(void **)&local_58,&else_body);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&else_body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      puVar9 = end->_M_current;
      puVar11 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                *plVar15;
    }
    if ((puVar9 == puVar11) ||
       (end->_M_current = puVar9 + 1,
       ((puVar9->_M_t).
        super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>._M_t
        .super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>.
        super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->type != EndIf)) {
LAB_0017d219:
      pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
      unterminated(pPVar10,(TemplateToken *)begin);
      __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    make_shared<minja::IfNode,minja::Location&,std::vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>>
              ((Location *)&else_body,
               (vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
                *)&((puVar3->_M_t).
                    super___uniq_ptr_impl<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_minja::TemplateToken_*,_std::default_delete<minja::TemplateToken>_>
                    .super__Head_base<0UL,_minja::TemplateToken_*,_false>._M_head_impl)->location);
    std::
    vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
    ::emplace_back<std::shared_ptr<minja::IfNode>>
              ((vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                *)&children,(shared_ptr<minja::IfNode> *)&else_body);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&else_body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
    ::~vector((vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
               *)&body);
  } while( true );
  if (((char)local_34 != '\0') &&
     (puVar3 != (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                *plVar15)) {
    pPVar10 = (Parser *)__cxa_allocate_exception(0x10);
    unexpected(pPVar10,(TemplateToken *)begin);
    __cxa_throw(pPVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (children.
      super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      children.
      super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)&else_body,
                   (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)begin);
    body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_b8;
    body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_b8._M_allocated_capacity = local_b8._M_allocated_capacity & 0xffffffffffffff00;
    std::make_shared<minja::TextNode,minja::Location,std::__cxx11::string>
              (&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&else_body);
    CVar14._M_current = local_40._M_current;
    _Var12._M_pi = local_58.source.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
    local_58.source.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)local_40._M_current =
         local_58.source.
         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40._M_current + 8))->_M_pi = _Var12._M_pi;
    local_58.source.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&body);
    psVar6 = &else_body;
  }
  else {
    if ((long)children.
              super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)children.
              super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x10) {
      peVar5 = ((children.
                 super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var13 = ((children.
                  super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      ((children.
        super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(element_type **)local_40._M_current = peVar5;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40._M_current + 8))->_M_pi = p_Var13;
      ((children.
        super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      CVar14._M_current = local_40._M_current;
      goto LAB_0017d449;
    }
    std::
    make_shared<minja::SequenceNode,minja::Location_const&,std::vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>>
              ((Location *)&body,
               (vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                *)&(((children.
                      super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   location_);
    _Var12 = body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    psVar6 = &body;
    body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)local_40._M_current =
         body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40._M_current + 8))->_M_pi = _Var12._M_pi;
    body.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    CVar14._M_current = local_40._M_current;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(psVar6->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
LAB_0017d449:
  std::
  vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  ::~vector(&children);
  sVar19.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar19.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CVar14._M_current;
  return (shared_ptr<minja::TemplateNode>)
         sVar19.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TemplateNode> parseTemplate(
          const TemplateTokenIterator & begin,
          TemplateTokenIterator & it,
          const TemplateTokenIterator & end,
          bool fully = false) const {
        std::vector<std::shared_ptr<TemplateNode>> children;
        while (it != end) {
          const auto start = it;
          const auto & token = *(it++);
          if (auto if_token = dynamic_cast<IfTemplateToken*>(token.get())) {
              std::vector<std::pair<std::shared_ptr<Expression>, std::shared_ptr<TemplateNode>>> cascade;
              cascade.emplace_back(std::move(if_token->condition), parseTemplate(begin, it, end));

              while (it != end && (*it)->type == TemplateToken::Type::Elif) {
                  auto elif_token = dynamic_cast<ElifTemplateToken*>((*(it++)).get());
                  cascade.emplace_back(std::move(elif_token->condition), parseTemplate(begin, it, end));
              }

              if (it != end && (*it)->type == TemplateToken::Type::Else) {
                cascade.emplace_back(nullptr, parseTemplate(begin, ++it, end));
              }
              if (it == end || (*(it++))->type != TemplateToken::Type::EndIf) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<IfNode>(token->location, std::move(cascade)));
          } else if (auto for_token = dynamic_cast<ForTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              auto else_body = std::shared_ptr<TemplateNode>();
              if (it != end && (*it)->type == TemplateToken::Type::Else) {
                else_body = parseTemplate(begin, ++it, end);
              }
              if (it == end || (*(it++))->type != TemplateToken::Type::EndFor) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<ForNode>(token->location, std::move(for_token->var_names), std::move(for_token->iterable), std::move(for_token->condition), std::move(body), for_token->recursive, std::move(else_body)));
          } else if (dynamic_cast<GenerationTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndGeneration) {
                  throw unterminated(**start);
              }
              // Treat as a no-op, as our scope is templates for inference, not training (`{% generation %}` wraps generated tokens for masking).
              children.emplace_back(std::move(body));
          } else if (auto text_token = dynamic_cast<TextTemplateToken*>(token.get())) {
              SpaceHandling pre_space = (it - 1) != begin ? (*(it - 2))->post_space : SpaceHandling::Keep;
              SpaceHandling post_space = it != end ? (*it)->pre_space : SpaceHandling::Keep;

              auto text = text_token->text;
              if (post_space == SpaceHandling::Strip) {
                static std::regex trailing_space_regex(R"(\s+$)");
                text = std::regex_replace(text, trailing_space_regex, "");
              } else if (options.lstrip_blocks && it != end) {
                auto i = text.size();
                while (i > 0 && (text[i - 1] == ' ' || text[i - 1] == '\t')) i--;
                if ((i == 0 && (it - 1) == begin) || (i > 0 && text[i - 1] == '\n')) {
                  text.resize(i);
                }
              }
              if (pre_space == SpaceHandling::Strip) {
                static std::regex leading_space_regex(R"(^\s+)");
                text = std::regex_replace(text, leading_space_regex, "");
              } else if (options.trim_blocks && (it - 1) != begin && !dynamic_cast<ExpressionTemplateToken*>((*(it - 2)).get())) {
                if (!text.empty() && text[0] == '\n') {
                  text.erase(0, 1);
                }
              }
              if (it == end && !options.keep_trailing_newline) {
                auto i = text.size();
                if (i > 0 && text[i - 1] == '\n') {
                  i--;
                  if (i > 0 && text[i - 1] == '\r') i--;
                  text.resize(i);
                }
              }
              children.emplace_back(std::make_shared<TextNode>(token->location, text));
          } else if (auto expr_token = dynamic_cast<ExpressionTemplateToken*>(token.get())) {
              children.emplace_back(std::make_shared<ExpressionNode>(token->location, std::move(expr_token->expr)));
          } else if (auto set_token = dynamic_cast<SetTemplateToken*>(token.get())) {
            if (set_token->value) {
              children.emplace_back(std::make_shared<SetNode>(token->location, set_token->ns, set_token->var_names, std::move(set_token->value)));
            } else {
              auto value_template = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndSet) {
                  throw unterminated(**start);
              }
              if (!set_token->ns.empty()) throw std::runtime_error("Namespaced set not supported in set with template value");
              if (set_token->var_names.size() != 1) throw std::runtime_error("Structural assignment not supported in set with template value");
              auto & name = set_token->var_names[0];
              children.emplace_back(std::make_shared<SetTemplateNode>(token->location, name, std::move(value_template)));
            }
          } else if (auto macro_token = dynamic_cast<MacroTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndMacro) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<MacroNode>(token->location, std::move(macro_token->name), std::move(macro_token->params), std::move(body)));
          } else if (auto filter_token = dynamic_cast<FilterTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndFilter) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<FilterNode>(token->location, std::move(filter_token->filter), std::move(body)));
          } else if (dynamic_cast<CommentTemplateToken*>(token.get())) {
              // Ignore comments
          } else if (auto ctrl_token = dynamic_cast<LoopControlTemplateToken*>(token.get())) {
              children.emplace_back(std::make_shared<LoopControlNode>(token->location, ctrl_token->control_type));
          } else if (dynamic_cast<EndForTemplateToken*>(token.get())
                  || dynamic_cast<EndSetTemplateToken*>(token.get())
                  || dynamic_cast<EndMacroTemplateToken*>(token.get())
                  || dynamic_cast<EndFilterTemplateToken*>(token.get())
                  || dynamic_cast<EndIfTemplateToken*>(token.get())
                  || dynamic_cast<ElseTemplateToken*>(token.get())
                  || dynamic_cast<EndGenerationTemplateToken*>(token.get())
                  || dynamic_cast<ElifTemplateToken*>(token.get())) {
              it--;  // unconsume the token
              break;  // exit the loop
          } else {
              throw unexpected(**(it-1));
          }
        }
        if (fully && it != end) {
            throw unexpected(**it);
        }
        if (children.empty()) {
          return std::make_shared<TextNode>(Location { template_str, 0 }, std::string());
        } else if (children.size() == 1) {
          return std::move(children[0]);
        } else {
          return std::make_shared<SequenceNode>(children[0]->location(), std::move(children));
        }
    }